

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledNewScObjArray_Impl<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>,true>
          (InterpreterStackFrame *this,
          OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,
          AuxArray<unsigned_int> *spreadIndices)

{
  ScriptContext *scriptContext;
  Var value;
  long lVar1;
  AuxArray<unsigned_int> *spreadIndices_00;
  uint uVar2;
  uint uVar3;
  void **__s;
  Type TVar4;
  void *apvStack_e0 [2];
  Var stackArgs [8];
  Arguments local_90;
  Arguments local_80 [3];
  Arguments local_50;
  AuxArray<unsigned_int> *local_40;
  Type local_38;
  
  TVar4 = (Type)((ulong)playout->ArgCount | 0x1000000);
  local_90.Values = *(Type *)(this + 0x28);
  if (spreadIndices != (AuxArray<unsigned_int> *)0x0) {
    apvStack_e0[0] = (void *)0xa88ad9;
    local_90.Info = TVar4;
    local_40 = spreadIndices;
    local_38 = local_90.Values;
    uVar2 = JavascriptFunction::GetSpreadSize
                      (&local_90,spreadIndices,*(ScriptContext **)(this + 0x78));
    uVar3 = (uVar2 & 0xffffff) + 0x1000000;
    local_50.Info._4_4_ = 0;
    local_50.Info._0_4_ = uVar3;
    if ((uVar2 & 0xffffff) < 9) {
      __s = apvStack_e0 + 1;
      stackArgs[5] = (Var)0x0;
      stackArgs[6] = (Var)0x0;
      stackArgs[3] = (Var)0x0;
      stackArgs[4] = (Var)0x0;
      stackArgs[1] = (Var)0x0;
      stackArgs[2] = (Var)0x0;
      apvStack_e0[1] = (void *)0x0;
      stackArgs[0] = (Var)0x0;
    }
    else {
      uVar3 = uVar3 * 8 & 0x7fffff8;
      apvStack_e0[0] = (void *)0xa88b17;
      ThreadContext::ProbeStack
                ((*(ScriptContext **)(this + 0x78))->threadContext,(ulong)uVar3 + 0xc00,
                 *(ScriptContext **)(this + 0x78),(PVOID)0x0);
      lVar1 = -(ulong)(uVar3 + 0xf & 0xfffffff0);
      __s = (void **)((long)stackArgs + lVar1 + -8);
      *(undefined8 *)((long)apvStack_e0 + lVar1) = 0xa88b36;
      memset(__s,0,(ulong)uVar3);
    }
    spreadIndices_00 = local_40;
    local_80[0].Values = local_38;
    scriptContext = *(ScriptContext **)(this + 0x78);
    local_80[0].Info = TVar4;
    local_50.Values = __s;
    __s[-1] = (void *)0xa88bd4;
    JavascriptFunction::SpreadArgs(local_80,&local_50,spreadIndices_00,scriptContext);
    value = *(Var *)(this + (ulong)playout->Function * 8 + 0x160);
    __s[-1] = &UNK_00a88bf8;
    ValidateRegValue(this,value,false,true);
  }
  local_38 = (Type)CONCAT44(local_38._4_4_,(int)playout->Return);
  apvStack_e0[0] = &UNK_00a88b5f;
  ValidateRegValue(this,*(Var *)(this + (ulong)playout->Function * 8 + 0x160),false,true);
}

Assistant:

void InterpreterStackFrame::OP_ProfiledNewScObjArray_Impl(const unaligned T* playout, const Js::AuxArray<uint32> *spreadIndices)
    {
        // Always profile this operation when auto-profiling so that array type changes are tracked
#if ENABLE_PROFILE_INFO
        if (!Profiled && !isAutoProfiling)
#else
        Assert(!Profiled);
#endif
        {
            OP_NewScObjArray_Impl<T, Profiled>(playout, spreadIndices);
            return;
        }

#if ENABLE_PROFILE_INFO
        Arguments args(CallInfo(CallFlags_New, playout->ArgCount), m_outParams);

        uint32 spreadSize = 0;
        if (spreadIndices != nullptr)
        {
            spreadSize = JavascriptFunction::GetSpreadSize(args, spreadIndices, scriptContext);

            // Allocate room on the stack for the spread args.
            Arguments outArgs(CallInfo(CallFlags_New, 0), nullptr);
            outArgs.Info.Count = spreadSize;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            size_t outArgsSize = 0;
            if (outArgs.Info.Count > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, outArgs.Info.Count * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                outArgsSize = outArgs.Info.Count * sizeof(Var);
                outArgs.Values = (Var*)_alloca(outArgsSize);
                ZeroMemory(outArgs.Values, outArgsSize);
            }
            else
            {
                outArgs.Values = stackArgs;
                outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
                ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
            }
            JavascriptFunction::SpreadArgs(args, outArgs, spreadIndices, scriptContext);

            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    outArgs,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        else
        {
            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    args,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        PopOut(playout->ArgCount);
#endif
    }